

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void build_cpush_cinv(m68k_info *info,int op_offset)

{
  cs_m68k *pcVar1;
  anon_union_8_5_85a7a27f_for_cs_m68k_op_0 aVar2;
  MCInst *inst;
  
  pcVar1 = build_init_op(info,0,2,0);
  switch(info->ir >> 3 & 3) {
  case 0:
    d68000_invalid(info);
    return;
  case 1:
    inst = info->inst;
    break;
  case 2:
    inst = info->inst;
    op_offset = op_offset + 1;
    break;
  case 3:
    pcVar1->op_count = '\x01';
    inst = info->inst;
    op_offset = op_offset + 2;
  }
  MCInst_setOpcode(inst,op_offset);
  pcVar1->operands[0].type = M68K_OP_IMM;
  pcVar1->operands[0].address_mode = M68K_AM_IMMEDIATE;
  aVar2._0_4_ = info->ir >> 6 & 3;
  aVar2.reg_pair.reg_1 = 0;
  pcVar1->operands[0].field_0 = aVar2;
  pcVar1->operands[1].type = M68K_OP_MEM;
  pcVar1->operands[1].address_mode = M68K_AM_REG_DIRECT_ADDR;
  pcVar1->operands[1].field_0.imm = (ulong)(info->ir & 7) + 9;
  return;
}

Assistant:

static void build_cpush_cinv(m68k_info *info, int op_offset)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, M68K_INS_INVALID, 2, 0);

	switch ((info->ir >> 3) & 3) { // scope
		// Invalid
		case 0:
			d68000_invalid(info);
			return;
			// Line
		case 1:
			MCInst_setOpcode(info->inst, op_offset + 0);
			break;
			// Page
		case 2:
			MCInst_setOpcode(info->inst, op_offset + 1);
			break;
			// All
		case 3:
			ext->op_count = 1;
			MCInst_setOpcode(info->inst, op_offset + 2);
			break;
	}

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	op0->address_mode = M68K_AM_IMMEDIATE;
	op0->type = M68K_OP_IMM;
	op0->imm = (info->ir >> 6) & 3;

	op1->type = M68K_OP_MEM;
	op1->address_mode = M68K_AM_REG_DIRECT_ADDR;
	op1->imm = M68K_REG_A0 + (info->ir & 7);
}